

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

Vec_Int_t * updateAnteConseVectors(antecedentConsequentVectorsStruct *anteConse)

{
  int Entry;
  int iVar1;
  Vec_Int_t *p;
  int i;
  
  if ((anteConse->attrAntecedents == (Vec_Int_t *)0x0) || (anteConse->attrAntecedents->nSize < 1)) {
    p = anteConse->attrConsequentCandidates;
  }
  else {
    p = Vec_IntAlloc(0);
    for (i = 0; i < anteConse->attrConsequentCandidates->nSize; i = i + 1) {
      Entry = Vec_IntEntry(anteConse->attrConsequentCandidates,i);
      iVar1 = Vec_IntFind(anteConse->attrAntecedents,Entry);
      if (iVar1 == -1) {
        Vec_IntPush(p,Entry);
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t *updateAnteConseVectors(struct antecedentConsequentVectorsStruct *anteConse )
{
	Vec_Int_t *vCandMonotone;
	int iElem, i;

	//if( vKnownMonotone == NULL || Vec_IntSize(vKnownMonotone) <= 0 )
	//	return vHintMonotone;
	if( anteConse->attrAntecedents == NULL  || Vec_IntSize(anteConse->attrAntecedents) <= 0 )
		return anteConse->attrConsequentCandidates;
	vCandMonotone = Vec_IntAlloc(0);
	Vec_IntForEachEntry( anteConse->attrConsequentCandidates, iElem, i )
	{
		if( Vec_IntFind( anteConse->attrAntecedents, iElem ) == -1 )
			Vec_IntPush( vCandMonotone, iElem );
	}
	
	return vCandMonotone;
}